

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O3

TransformDerivative * __thiscall
iDynTree::TransformDerivative::derivativeOfInverse
          (TransformDerivative *__return_storage_ptr__,TransformDerivative *this,Transform *a_H_b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Position *pPVar11;
  Rotation *pRVar12;
  long lVar13;
  double *pdVar14;
  PointerType ptr;
  PointerType ptr_2;
  PointerType ptr_1;
  double dVar15;
  double dVar16;
  Packet2d mask;
  DstEvaluatorType dstEvaluator;
  type tmp;
  Transform b_H_a;
  assign_op<double,_double> local_179;
  plainobjectbase_evaluator_data<double,_3> local_178;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_170;
  SrcEvaluatorType local_150;
  DstXprType local_d8;
  Transform local_88;
  
  Transform::inverse(&local_88,a_H_b);
  pPVar11 = Transform::getPosition(&local_88);
  pRVar12 = Transform::getRotation(&local_88);
  dVar10 = (pRVar12->super_Matrix3x3).m_data[0];
  dVar15 = (pRVar12->super_Matrix3x3).m_data[1];
  dVar16 = (pRVar12->super_Matrix3x3).m_data[2];
  dVar1 = (pRVar12->super_Matrix3x3).m_data[6];
  dVar2 = (pRVar12->super_Matrix3x3).m_data[7];
  dVar3 = (pRVar12->super_Matrix3x3).m_data[5];
  dVar4 = (pRVar12->super_Matrix3x3).m_data[8];
  dVar5 = (pRVar12->super_Matrix3x3).m_data[4];
  dVar6 = (pRVar12->super_Matrix3x3).m_data[3];
  lVar13 = 3;
  pdVar14 = (double *)((long)&local_150 + 0x10);
  do {
    dVar7 = (this->posDerivative).m_data[lVar13];
    dVar8 = (this->rotDerivative).m_data[lVar13];
    dVar9 = (this->rotDerivative).m_data[lVar13 + 3];
    pdVar14[-2] = (dVar9 * -dVar16 - dVar8 * dVar15) - dVar7 * dVar10;
    pdVar14[-1] = (dVar9 * -dVar3 - dVar8 * dVar5) - dVar7 * dVar6;
    *pdVar14 = (dVar9 * -dVar4 - dVar2 * dVar8) - dVar1 * dVar7;
    lVar13 = lVar13 + 1;
    pdVar14 = pdVar14 + 3;
  } while (lVar13 != 6);
  local_170.m_src = &local_150;
  local_150.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 3;
  local_178.data = (double *)&local_d8;
  local_170.m_dst = (DstEvaluatorType *)&local_178;
  local_170.m_functor = &local_179;
  local_170.m_dstExpr = (DstXprType *)local_178.data;
  local_150.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pRVar12;
  local_150.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)local_170.m_src;
  local_150.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.
  super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
  .m_data = (PointerType)pRVar12;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_170);
  (__return_storage_ptr__->rotDerivative).m_data[0] =
       local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  (__return_storage_ptr__->rotDerivative).m_data[1] =
       local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  (__return_storage_ptr__->rotDerivative).m_data[2] =
       local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  (__return_storage_ptr__->rotDerivative).m_data[3] =
       local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [3];
  (__return_storage_ptr__->rotDerivative).m_data[4] =
       local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [4];
  (__return_storage_ptr__->rotDerivative).m_data[5] =
       local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5];
  (__return_storage_ptr__->rotDerivative).m_data[6] =
       local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6];
  (__return_storage_ptr__->rotDerivative).m_data[7] =
       local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  (__return_storage_ptr__->rotDerivative).m_data[8] =
       local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [8];
  dVar2 = (pPVar11->super_Vector3).m_data[0];
  dVar3 = (pPVar11->super_Vector3).m_data[1];
  dVar1 = (pPVar11->super_Vector3).m_data[2];
  dVar15 = (this->rotDerivative).m_data[2] * dVar1 +
           (this->rotDerivative).m_data[1] * dVar3 + (this->rotDerivative).m_data[0] * dVar2 +
           (this->posDerivative).m_data[0];
  dVar16 = (this->rotDerivative).m_data[5] * dVar1 +
           (this->rotDerivative).m_data[4] * dVar3 + (this->rotDerivative).m_data[3] * dVar2 +
           (this->posDerivative).m_data[1];
  dVar3 = dVar1 * (this->rotDerivative).m_data[8] +
          (this->rotDerivative).m_data[7] * dVar3 + (this->rotDerivative).m_data[6] * dVar2 +
          (this->posDerivative).m_data[2];
  dVar4 = (pRVar12->super_Matrix3x3).m_data[3];
  dVar5 = (pRVar12->super_Matrix3x3).m_data[4];
  dVar1 = (pRVar12->super_Matrix3x3).m_data[5];
  dVar6 = (pRVar12->super_Matrix3x3).m_data[6];
  dVar10 = (pRVar12->super_Matrix3x3).m_data[7];
  dVar2 = (pRVar12->super_Matrix3x3).m_data[8];
  (__return_storage_ptr__->posDerivative).m_data[0] =
       (-(pRVar12->super_Matrix3x3).m_data[1] * dVar16 +
       -(pRVar12->super_Matrix3x3).m_data[0] * dVar15) -
       (pRVar12->super_Matrix3x3).m_data[2] * dVar3;
  (__return_storage_ptr__->posDerivative).m_data[1] =
       (-dVar5 * dVar16 + -dVar4 * dVar15) - dVar1 * dVar3;
  (__return_storage_ptr__->posDerivative).m_data[2] =
       (-dVar10 * dVar16 + -dVar6 * dVar15) - dVar3 * dVar2;
  return __return_storage_ptr__;
}

Assistant:

TransformDerivative TransformDerivative::derivativeOfInverse(const Transform& a_H_b) const
{
    Transform b_H_a = a_H_b.inverse();

    TransformDerivative ret;

    // For the sake of compact notation, we will indicated
    // a_R_b the rotational part of a_H_b, and a_O_b the translation part of a_H_b)
    Eigen::Map<const Eigen::Vector3d> d_a_O_b(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > d_a_R_b(this->rotDerivative.data());

    Eigen::Map<const Eigen::Vector3d> b_O_a(b_H_a.getPosition().data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > b_R_a(b_H_a.getRotation().data());

    Eigen::Map<Eigen::Vector3d> d_b_O_a(ret.posDerivative.data());
    Eigen::Map<Eigen::Matrix<double,3,3,Eigen::RowMajor> > d_b_R_a(ret.rotDerivative.data());

    // ~^b \dot{R}_a = - b_R_a a_\dot{R}_b b_R_a
    d_b_R_a = -b_R_a*d_a_R_b*b_R_a;

    // ~^b \dot{O}_a = - b_R_a*(a_\dot{R}_b ~^b O_a + ~^a \dot{O}_b
    d_b_O_a = -b_R_a*(d_a_R_b*b_O_a+d_a_O_b);

    return ret;
}